

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lice.cc
# Opt level: O3

vector<SensorReading,_std::allocator<SensorReading>_> * __thiscall
P8Lice::getReadings(vector<SensorReading,_std::allocator<SensorReading>_> *__return_storage_ptr__,
                   P8Lice *this,time_t start_time,time_t stop_time)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  JSONArray *a;
  JSONValue *pJVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
  *pmVar7;
  longlong *plVar8;
  double *pdVar9;
  bool *pbVar10;
  char *__end;
  JSONArray rows;
  SensorReading toadd;
  JSONObject reply;
  stringstream keys;
  int local_334;
  key_type local_330;
  key_type local_310;
  JSONArray local_2f0;
  vector<SensorReading,_std::allocator<SensorReading>_> *local_2e0;
  undefined1 local_2d8 [48];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  longlong local_288;
  long local_280;
  bool local_278;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  double local_250;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string local_228;
  string local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->super__Vector_base<SensorReading,_std::allocator<SensorReading>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SensorReading,_std::allocator<SensorReading>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SensorReading,_std::allocator<SensorReading>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"?startkey=",10);
  poVar4 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"000&endkey=",0xb);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"000",3);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"_design/plotdata/_view/all","");
  std::__cxx11::stringbuf::str();
  CouchDBInterface::getView((JSONObject *)&local_1e8,&this->interface,&local_228,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"rows","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                         *)&local_1e8,(key_type *)local_2d8);
  a = JSON::JSONValue::getArrayValue(pmVar5);
  JSON::JSONArray::JSONArray(&local_2f0,a);
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_,CONCAT71(local_2d8._17_7_,local_2d8[0x10]) + 1);
  }
  if ((local_2f0.n_elements != 0) && (local_334 = 0, 0 < local_2f0.n_elements)) {
    paVar1 = &local_310.field_2;
    paVar2 = &local_330.field_2;
    do {
      local_2d8._0_8_ = local_2d8 + 0x10;
      local_2d8._8_8_ = 0;
      local_2d8[0x10] = '\0';
      local_2a8._M_p = (pointer)&local_298;
      local_2a0 = 0;
      local_298._M_local_buf[0] = '\0';
      local_270._M_p = (pointer)&local_260;
      local_268 = 0;
      local_260._M_local_buf[0] = '\0';
      local_248._M_p = (pointer)&local_238;
      local_240 = 0;
      local_238._M_local_buf[0] = '\0';
      pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
      local_310._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_310);
      local_330._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"sensor_name","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_330);
      JSON::JSONValue::getStringValue_abi_cxx11_(pmVar5);
      std::__cxx11::string::_M_assign((string *)local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
      local_310._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_310);
      local_330._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"timestamp_mseconds","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_330);
      plVar8 = JSON::JSONValue::getIntValue(pmVar5);
      local_288 = *plVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      local_280 = local_288 / 1000;
      pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
      local_310._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_310);
      local_330._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"units","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_330);
      JSON::JSONValue::getStringValue_abi_cxx11_(pmVar5);
      std::__cxx11::string::_M_assign((string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
      local_310._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_310);
      local_330._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_330);
      pdVar9 = JSON::JSONValue::getDoubleValue(pmVar5);
      local_2d8._32_8_ = *pdVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
      local_310._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_310);
      local_330._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"uncalibrated_value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_330);
      bVar3 = JSON::JSONValue::isNull(pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
        local_310._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
        pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
        ;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                 ::operator[](pmVar7,&local_310);
        local_330._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_330,"uncalibrated_value","");
        pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
        ;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                 ::operator[](pmVar7,&local_330);
        pdVar9 = JSON::JSONValue::getDoubleValue(pmVar5);
        local_250 = *pdVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != paVar1) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
      }
      pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
      local_310._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_310);
      local_330._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"uncalibrated_units","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_330);
      bVar3 = JSON::JSONValue::isNull(pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
        local_310._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
        pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
        ;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                 ::operator[](pmVar7,&local_310);
        local_330._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_330,"uncalibrated_units","");
        pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
        ;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                 ::operator[](pmVar7,&local_330);
        JSON::JSONValue::getStringValue_abi_cxx11_(pmVar5);
        std::__cxx11::string::_M_assign((string *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != paVar1) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
      }
      pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
      local_310._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_310);
      local_330._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"precision","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_330);
      bVar3 = JSON::JSONValue::isNull(pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
        local_310._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
        pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
        ;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                 ::operator[](pmVar7,&local_310);
        local_330._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"precision","");
        pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
        ;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                 ::operator[](pmVar7,&local_330);
        plVar8 = JSON::JSONValue::getIntValue(pmVar5);
        local_2d8._40_4_ = (undefined4)*plVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != paVar1) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
      }
      pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
      local_310._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_310);
      local_330._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"has_error","");
      pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
      ;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
               ::operator[](pmVar7,&local_330);
      bVar3 = JSON::JSONValue::isNull(pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != paVar1) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        local_278 = false;
      }
      else {
        pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
        local_310._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
        pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
        ;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                 ::operator[](pmVar7,&local_310);
        local_330._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"has_error","");
        pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
        ;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                 ::operator[](pmVar7,&local_330);
        pbVar10 = JSON::JSONValue::getBoolValue(pmVar5);
        local_278 = *pbVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != paVar1) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((local_278 & 1U) != 0) {
          pJVar6 = JSON::JSONArray::operator[](&local_2f0,&local_334);
          local_310._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"value","");
          pmVar7 = &JSON::JSONValue::getObjectValue(pJVar6)->
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
          ;
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                   ::operator[](pmVar7,&local_310);
          local_330._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"error_value","");
          pmVar7 = &JSON::JSONValue::getObjectValue(pmVar5)->
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
          ;
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                   ::operator[](pmVar7,&local_330);
          JSON::JSONValue::getStringValue_abi_cxx11_(pmVar5);
          std::__cxx11::string::_M_assign((string *)&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != paVar2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != paVar1) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::vector<SensorReading,_std::allocator<SensorReading>_>::push_back
                (local_2e0,(value_type *)local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,
                        CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_p != &local_260) {
        operator_delete(local_270._M_p,
                        CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_p != &local_298) {
        operator_delete(local_2a8._M_p,
                        CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
        operator_delete((void *)local_2d8._0_8_,CONCAT71(local_2d8._17_7_,local_2d8[0x10]) + 1);
      }
      local_334 = local_334 + 1;
    } while (local_334 < local_2f0.n_elements);
  }
  JSON::JSONArray::~JSONArray(&local_2f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
  ::~_Rb_tree(&local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_2e0;
}

Assistant:

vector<SensorReading> P8Lice::getReadings(time_t start_time, time_t stop_time) {
	vector<SensorReading> ret;
	stringstream keys;
	keys << "?startkey=" << start_time << "000&endkey=" << stop_time << "000";
	JSONObject reply=interface.getView("_design/plotdata/_view/all",keys.str());
	JSONArray rows=reply["rows"].getArrayValue();
	if(rows.length()==0)
		return ret;
	for(int i=0;i<rows.length();i++) {
		SensorReading toadd;
		toadd.sensor_name=rows[i]["value"]["sensor_name"].getStringValue();
		toadd.timestamp_ms=rows[i]["value"]["timestamp_mseconds"].getIntValue();
		toadd.timestamp=(toadd.timestamp_ms)/1000;
		toadd.units=rows[i]["value"]["units"].getStringValue();
		toadd.value=rows[i]["value"]["value"].getDoubleValue();
		if(!rows[i]["value"]["uncalibrated_value"].isNull())
			toadd.uncalibrated_value=rows[i]["value"]["uncalibrated_value"].getDoubleValue();
		if(!rows[i]["value"]["uncalibrated_units"].isNull())
			toadd.uncalibrated_units=rows[i]["value"]["uncalibrated_units"].getStringValue();
		if(!rows[i]["value"]["precision"].isNull())
			toadd.precision=rows[i]["value"]["precision"].getIntValue();
		if(!rows[i]["value"]["has_error"].isNull())
			toadd.has_error=rows[i]["value"]["has_error"].getBoolValue();
		else
			toadd.has_error=false;
		if(toadd.has_error)
			toadd.error_value=rows[i]["value"]["error_value"].getStringValue();
		ret.push_back(toadd);
	}
	return ret;
}